

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O2

void __thiscall RotatingLog_TwoRotations_Test::TestBody(RotatingLog_TwoRotations_Test *this)

{
  mock_string_stream_traits *this_00;
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  mock_file_system_traits *this_02;
  pointer pbVar1;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar2;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  *this_03;
  TypedExpectation<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_04;
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_05;
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  pointer message;
  mock_string_stream_traits *in_R8;
  char *message_00;
  mock_file_system_traits *in_R9;
  long lVar5;
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_6b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_668;
  AssertionResult gtest_ar;
  string local_578;
  ostringstream str;
  undefined1 auStack_550 [368];
  log_type log;
  
  std::__cxx11::string::string((string *)&local_578,"base_name",(allocator *)&messages);
  anon_unknown.dwarf_27d855::mock_string_stream_traits::mock_string_stream_traits
            ((mock_string_stream_traits *)&str);
  anon_unknown.dwarf_27d855::mock_file_system_traits::mock_file_system_traits
            ((mock_file_system_traits *)&gtest_ar);
  pstore::
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  ::basic_rotating_log(&log,&local_578,100,2,in_R8,in_R9);
  anon_unknown.dwarf_27d855::mock_file_system_traits::~mock_file_system_traits
            ((mock_file_system_traits *)&gtest_ar);
  anon_unknown.dwarf_27d855::mock_string_stream_traits::~mock_string_stream_traits
            ((mock_string_stream_traits *)&str);
  std::__cxx11::string::~string((string *)&local_578);
  this_00 = &log.stream_traits_;
  local_6b0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::__cxx11::ostringstream&>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::ostringstream&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable_abi_cxx11_;
  local_6b0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00259df8;
  this_01 = &log.stream_traits_.gmock01_clear_46;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_01->super_UntypedFunctionMockerBase,this_00);
  testing::
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Matcher((Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *)&str,(Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)&local_6b0);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::With((MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)&gtest_ar,this_01,
         (Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)&str);
  testing::internal::
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&str);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&gtest_ar,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x6c,"string_stream","clear (_)");
  testing::AnyNumber();
  testing::internal::ExpectationBase::UntypedTimes
            (&pTVar2->super_ExpectationBase,(Cardinality *)&local_668);
  _str = (_func_int **)0x0;
  auStack_550._0_8_ = (VTable *)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_550._8_8_ = (char *)0x0;
  auStack_550._16_8_ = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp:110:38)>
                ::_M_manager;
  std::_Function_base::~_Function_base((_Function_base *)&str);
  testing::internal::
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillRepeatedly(pTVar2,(Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)&messages);
  std::_Function_base::~_Function_base((_Function_base *)&messages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_668.vtable_);
  testing::internal::
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&gtest_ar.message_);
  testing::internal::
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_6b0);
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)testing::internal::MatcherBase<std::__cxx11::ostringstream&>::
                GetVTable<testing::internal::MatcherBase<std::__cxx11::ostringstream&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                ::kVTable_abi_cxx11_;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__MatcherBase_00259df8;
  testing::StrEq<char[10]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar,(StringLike<char[10]> *)"base_name");
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_6b0,(PolymorphicMatcher *)&gtest_ar);
  local_668.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::_Ios_Openmode>::
       GetVTable<testing::internal::MatcherBase<std::_Ios_Openmode>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_668.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00259f38;
  anon_unknown.dwarf_27d855::mock_string_stream_traits::gmock_open
            ((MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
              *)&str,this_00,
             (Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&messages,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_6b0,(Matcher<std::_Ios_Openmode> *)&local_668);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
            ::InternalExpectedAt
                      ((MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
                        *)&str,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                       ,0x70,"string_stream","open (_, StrEq (\"base_name\"), _)");
  testing::internal::
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::Times(this_03,3);
  std::
  _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
                  *)auStack_550);
  testing::internal::MatcherBase<std::_Ios_Openmode>::~MatcherBase
            ((MatcherBase<std::_Ios_Openmode> *)&local_668);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_6b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&messages);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )testing::internal::MatcherBase<std::__cxx11::ostringstream&>::
         GetVTable<testing::internal::MatcherBase<std::__cxx11::ostringstream&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable_abi_cxx11_;
  gtest_ar._0_8_ = &PTR__MatcherBase_00259df8;
  anon_unknown.dwarf_27d855::mock_string_stream_traits::gmock_close
            ((MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&str,this_00,
             (Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_ar);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&str,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x71,"string_stream","close (_)");
  testing::internal::
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar2,3);
  this_02 = &log.file_system_traits_;
  testing::internal::
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)auStack_550);
  testing::internal::
  MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&gtest_ar);
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)&testing::internal::MatcherBase<std::__cxx11::string_const&>::
                 GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                 ::kVTable_abi_cxx11_;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__MatcherBase_00259e98;
  anon_unknown.dwarf_27d855::mock_file_system_traits::gmock_exists
            ((MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&str,this_02,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&messages);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&str,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                       ,0x73,"file_system","exists (_)");
  testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)&local_6b0,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&gtest_ar,(ReturnAction *)&local_6b0);
  testing::internal::
  TypedExpectation<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillRepeatedly(this_04,(Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_6b0.vtable_);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)auStack_550);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&messages);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&testing::internal::MatcherBase<std::__cxx11::string_const&>::
          GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
          ::kVTable_abi_cxx11_;
  gtest_ar._0_8_ = &PTR__MatcherBase_00259e98;
  anon_unknown.dwarf_27d855::mock_file_system_traits::gmock_unlink
            ((MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&str,this_02,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_ar);
  testing::internal::GetWithoutMatchers();
  this_05 = testing::internal::
            MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&str,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                       ,0x74,"file_system","unlink (_)");
  testing::AnyNumber();
  testing::internal::ExpectationBase::UntypedTimes
            (&this_05->super_ExpectationBase,(Cardinality *)&messages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &messages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)auStack_550);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&gtest_ar);
  testing::StrEq<char[12]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar,(StringLike<char[12]> *)"base_name.1");
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_6b0,(PolymorphicMatcher *)&gtest_ar);
  testing::StrEq<char[12]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&messages,(StringLike<char[12]> *)"base_name.2");
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_668,(PolymorphicMatcher *)&messages);
  anon_unknown.dwarf_27d855::mock_file_system_traits::gmock_rename
            ((MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&str,this_02,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_6b0,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_668);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&str,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x75,"file_system",
                      "rename (StrEq (\"base_name.1\"), StrEq (\"base_name.2\"))");
  testing::internal::
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar3,2);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                  *)auStack_550);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_668);
  std::__cxx11::string::~string((string *)&messages);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_6b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::StrEq<char[10]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar,(StringLike<char[10]> *)"base_name");
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_6b0,(PolymorphicMatcher *)&gtest_ar);
  testing::StrEq<char[12]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&messages,(StringLike<char[12]> *)"base_name.1");
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_668,(PolymorphicMatcher *)&messages);
  anon_unknown.dwarf_27d855::mock_file_system_traits::gmock_rename
            ((MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&str,this_02,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_6b0,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_668);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&str,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x76,"file_system","rename (StrEq (\"base_name\"), StrEq (\"base_name.1\"))")
  ;
  testing::internal::
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar3,2);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                  *)auStack_550);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_668);
  std::__cxx11::string::~string((string *)&messages);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_6b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = 0;
  while (pbVar1 = messages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, lVar5 < 200) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar4 = std::operator<<((ostream *)&str,"message ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&messages,(value_type *)&gtest_ar);
    lVar5 = lVar5 + (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  }
  for (message = messages.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; message != pbVar1; message = message + 1
      ) {
    pstore::
    basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
    ::log_impl(&log,message);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"message 21\"","log.stream ().str ()",
             (char (*) [11])"message 21",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
  std::__cxx11::string::~string((string *)&str);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&str);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message_00 = "";
    }
    else {
      message_00 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
               ,0x90,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b0,(Message *)&str);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b0);
    if ((_func_int **)_str != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_str + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&messages);
  pstore::
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  ::~basic_rotating_log(&log);
  return;
}

Assistant:

TEST (RotatingLog, TwoRotations) {
    using ::testing::_;
    using ::testing::AnyNumber;
    using ::testing::Invoke;
    using ::testing::Return;
    using ::testing::StrEq;

    using log_type = pstore::basic_rotating_log<mock_string_stream_traits, mock_file_system_traits>;

    // We'll contrive two rollovers by generating at least max_size * num_backups
    // worth of output.
    constexpr auto max_size = std::streamoff{100};
    constexpr auto num_backups = 2U;
    log_type log ("base_name", max_size, num_backups);

    // Check that the rollover process renames bn1->bn2 and bn->bn1 twice each (once
    // for each rollover. I also check that we open the real output file three times;
    // that is, two rollovers and a partially filled third file.
    {
        auto & string_stream = log.stream_traits ();
        auto & file_system = log.file_system_traits ();

        // I need the clear() method to really clear the stream contents.
        EXPECT_CALL (string_stream, clear (_))
            .Times (AnyNumber ())
            .WillRepeatedly (Invoke ([] (std::ostringstream & os) { os.str (""); }));

        EXPECT_CALL (string_stream, open (_, StrEq ("base_name"), _)).Times (3);
        EXPECT_CALL (string_stream, close (_)).Times (3);

        EXPECT_CALL (file_system, exists (_)).WillRepeatedly (Return (true));
        EXPECT_CALL (file_system, unlink (_)).Times (AnyNumber ());
        EXPECT_CALL (file_system, rename (StrEq ("base_name.1"), StrEq ("base_name.2"))).Times (2);
        EXPECT_CALL (file_system, rename (StrEq ("base_name"), StrEq ("base_name.1"))).Times (2);
    }

    // Put together an array of strings which contain "message" followed by the decimal offset
    // of the string. We want one more than will fit in "max_size" bytes (not including line
    // feeds).
    std::vector<std::string> messages;
    {
        auto size = std::streamoff{0};
        auto index = 1U;
        while (size < max_size * num_backups) {
            std::ostringstream str;
            str << "message " << index;
            std::string const & message = str.str ();
            messages.push_back (message);

            size += message.size ();
            ++index;
        }
    }
    // Now log each of the strings.
    for (auto const & m : messages) {
        log.log_impl (m);
    }

    // A single copy of the string is left in the active "file".
    EXPECT_EQ ("message 21", log.stream ().str ());
}